

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::ContainsSizedIntOrFloatType
          (ValidationState_t *this,uint32_t id,Op type,uint32_t width)

{
  bool bVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if (type - OpTypeVector < 0xfffffffe) {
    bVar1 = false;
  }
  else {
    local_30._8_8_ = 0;
    local_30._M_unused._M_member_pointer = CONCAT44(width,type);
    local_18 = std::
               _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:1689:18)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:1689:18)>
               ::_M_manager;
    bVar1 = ContainsType(this,id,(function<bool_(const_spvtools::val::Instruction_*)> *)&local_30,
                         true);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
  }
  return bVar1;
}

Assistant:

bool ValidationState_t::ContainsSizedIntOrFloatType(uint32_t id, spv::Op type,
                                                    uint32_t width) const {
  if (type != spv::Op::OpTypeInt && type != spv::Op::OpTypeFloat) return false;

  const auto f = [type, width](const Instruction* inst) {
    if (inst->opcode() == type) {
      return inst->GetOperandAs<uint32_t>(1u) == width;
    }
    return false;
  };
  return ContainsType(id, f);
}